

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void bench(llama_sampler *cnstr,char *cnstr_name,
          vector<llama_token_data,_std::allocator<llama_token_data>_> *data,int n_iter)

{
  pointer plVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur;
  llama_token_data_array cur_p_1;
  llama_token_data_array cur_p;
  
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
            (&cur,((long)(data->
                         super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(data->
                        super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0xc,(allocator_type *)&cur_p);
  plVar1 = (data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)plVar1;
  if (sVar4 != 0) {
    memmove(cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
            super__Vector_impl_data._M_start,plVar1,sVar4);
  }
  cur_p.data = cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
               super__Vector_impl_data._M_start;
  cur_p.size = ((long)cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xc;
  cur_p.selected = -1;
  cur_p.sorted = false;
  llama_sampler_apply(cnstr,&cur_p,
                      ((long)cur.
                             super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)cur.
                            super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                            _M_impl.super__Vector_impl_data._M_start) % 0xc);
  llama_sampler_reset(cnstr);
  lVar2 = ggml_time_us();
  iVar5 = 0x20;
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    plVar1 = (data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>)._M_impl
             .super__Vector_impl_data._M_start;
    sVar4 = (long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)plVar1;
    if (sVar4 != 0) {
      memmove(cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
              super__Vector_impl_data._M_start,plVar1,sVar4);
    }
    cur_p_1.data = cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    cur_p_1.size = ((long)cur.
                          super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    cur_p_1.selected = -1;
    cur_p_1.sorted = false;
    llama_sampler_apply(cnstr,&cur_p_1,
                        ((long)cur.
                               super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)cur.
                              super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                              ._M_impl.super__Vector_impl_data._M_start) % 0xc);
    llama_sampler_reset(cnstr);
  }
  lVar3 = ggml_time_us();
  llama_sampler_free(cnstr);
  printf("%-43s: %8.3f us/iter\n",(double)((float)(lVar3 - lVar2) * 0.03125),cnstr_name);
  std::_Vector_base<llama_token_data,_std::allocator<llama_token_data>_>::~_Vector_base
            (&cur.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>);
  return;
}

Assistant:

static void bench(llama_sampler * cnstr, const char * cnstr_name, const std::vector<llama_token_data> & data, int n_iter) {
    std::vector<llama_token_data> cur(data.size());
    std::copy(data.begin(), data.end(), cur.begin());
    llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
    llama_sampler_apply(cnstr, &cur_p);
    llama_sampler_reset(cnstr);
    const int64_t t_start = ggml_time_us();
    for (int i = 0; i < n_iter; i++) {
        std::copy(data.begin(), data.end(), cur.begin());
        llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
        llama_sampler_apply(cnstr, &cur_p);
        llama_sampler_reset(cnstr);
    }
    const int64_t t_end = ggml_time_us();
    llama_sampler_free(cnstr);
    printf("%-43s: %8.3f us/iter\n", cnstr_name, (t_end - t_start) / (float)n_iter);
}